

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_UnrecognizedExtraParameters_Test::TestBody
          (CommandLineInterfaceTest_UnrecognizedExtraParameters_Test *this)

{
  string_view name;
  string_view expected_substring;
  string_view expected_substring_00;
  string_view contents;
  string local_38;
  
  name._M_str = "foo.proto";
  name._M_len = 9;
  contents._M_str = "syntax = \"proto2\";\nmessage Foo {}\n";
  contents._M_len = 0x22;
  CommandLineInterfaceTester::CreateTempFile((CommandLineInterfaceTester *)this,name,contents);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "protocol_compiler --plug_out=TestParameter:$tmpdir --unknown_plug_a_opt=Foo --unknown_plug_b_opt=Bar --proto_path=$tmpdir foo.proto"
             ,"");
  CommandLineInterfaceTest::Run(&this->super_CommandLineInterfaceTest,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  expected_substring._M_str = "Unknown flag: --unknown_plug_a_opt";
  expected_substring._M_len = 0x22;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring);
  expected_substring_00._M_str = "Unknown flag: --unknown_plug_b_opt";
  expected_substring_00._M_len = 0x22;
  CommandLineInterfaceTester::ExpectErrorSubstring
            ((CommandLineInterfaceTester *)this,expected_substring_00);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, UnrecognizedExtraParameters) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --plug_out=TestParameter:$tmpdir "
      "--unknown_plug_a_opt=Foo "
      "--unknown_plug_b_opt=Bar "
      "--proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring("Unknown flag: --unknown_plug_a_opt");
  ExpectErrorSubstring("Unknown flag: --unknown_plug_b_opt");
}